

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O1

void __thiscall HEkkPrimal::update(HEkkPrimal *this)

{
  HighsInt *pHVar1;
  int iVar2;
  int iVar3;
  HEkk *pHVar4;
  HEkk *pHVar5;
  double dVar6;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  string local_90;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pHVar4 = this->ekk_instance_;
  iVar2 = this->row_out;
  if (iVar2 < 0) {
    iVar3 = this->variable_in;
    this->variable_out = iVar3;
    this->alpha_col = 0.0;
    this->numericalTrouble = 0.0;
    (pHVar4->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[iVar3] = this->value_in;
    (pHVar4->basis_).nonbasicMove_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
    _M_impl.super__Vector_impl_data._M_start[iVar3] = -(char)this->move_in;
  }
  else {
    adjustPerturbedEquationOut(this);
  }
  this->max_changed_measure_value = 0.0;
  this->max_changed_measure_column = -1;
  this->done_next_chuzc = false;
  if (this->solve_phase == 1) {
    phase1UpdatePrimal(this);
    basicFeasibilityChangeUpdateDual(this);
    hyperChooseColumnBasicFeasibilityChange(this);
  }
  else {
    phase2UpdatePrimal(this,false);
  }
  if (iVar2 < 0) {
    pHVar1 = &(pHVar4->info_).primal_bound_swap;
    *pHVar1 = *pHVar1 + 1;
    HEkk::invalidateDualInfeasibilityRecord(this->ekk_instance_);
    iterationAnalysis(this);
    localReportIter(this,false);
    this->num_flip_since_rebuild = this->num_flip_since_rebuild + 1;
    this->ekk_instance_->total_synthetic_tick_ =
         (this->col_aq).synthetic_tick + this->ekk_instance_->total_synthetic_tick_;
  }
  else {
    (pHVar4->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[this->row_out] = this->value_in;
    considerInfeasibleValueIn(this);
    this->theta_dual =
         (pHVar4->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[this->variable_in];
    updateDual(this);
    if (this->edge_weight_mode == kSteepestEdge) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"before update","");
      debugPrimalSteepestEdgeWeights(this,2);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      updatePrimalSteepestEdgeWeights(this);
    }
    else if (this->edge_weight_mode == kDevex) {
      updateDevex(this);
    }
    removeNonbasicFreeColumn(this);
    hyperChooseColumnDualChange(this);
    pHVar5 = this->ekk_instance_;
    if ((pHVar5->status_).has_dual_steepest_edge_weights == true) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"before update","");
      HEkk::devDebugDualSteepestEdgeWeights(pHVar5,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      updateDualSteepestEdgeWeights(this);
    }
    HEkk::transformForUpdate
              (this->ekk_instance_,&this->col_aq,&this->row_ep,this->variable_in,&this->row_out);
    HEkk::updatePivots(this->ekk_instance_,this->variable_in,this->row_out,this->move_out);
    HEkk::updateFactor(this->ekk_instance_,&this->col_aq,&this->row_ep,&this->row_out,
                       &this->rebuild_reason);
    pHVar5 = this->ekk_instance_;
    if ((pHVar5->status_).has_dual_steepest_edge_weights == true) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"after  update","");
      HEkk::devDebugDualSteepestEdgeWeights(pHVar5,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
    }
    if (this->edge_weight_mode == kSteepestEdge) {
      local_b0[0] = local_a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"after update","");
      debugPrimalSteepestEdgeWeights(this,2);
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0]);
      }
    }
    HEkk::updateMatrix(this->ekk_instance_,this->variable_in,this->variable_out);
    if ((pHVar4->info_).update_limit <= (pHVar4->info_).update_count) {
      this->rebuild_reason = 1;
    }
    pHVar1 = &this->ekk_instance_->iteration_count_;
    *pHVar1 = *pHVar1 + 1;
    if ((this->edge_weight_mode == kDevex) && (3 < this->num_bad_devex_weight_)) {
      initialiseDevexFramework(this);
    }
    iterationAnalysis(this);
    localReportIter(this,false);
    pHVar4 = this->ekk_instance_;
    dVar6 = (this->col_aq).synthetic_tick + pHVar4->total_synthetic_tick_;
    pHVar4->total_synthetic_tick_ = dVar6;
    pHVar4->total_synthetic_tick_ = dVar6 + (this->row_ep).synthetic_tick;
    hyperChooseColumn(this);
  }
  return;
}

Assistant:

void HEkkPrimal::update() {
  // Perform update operations that are independent of phase
  HighsSimplexInfo& info = ekk_instance_.info_;
  assert(!rebuild_reason);
  bool flipped = row_out < 0;
  if (flipped) {
    variable_out = variable_in;
    alpha_col = 0;
    numericalTrouble = 0;
    info.workValue_[variable_in] = value_in;
    assert(ekk_instance_.basis_.nonbasicMove_[variable_in] == move_in);
    ekk_instance_.basis_.nonbasicMove_[variable_in] = -move_in;
  } else {
    // Adjust perturbation if leaving equation
    adjustPerturbedEquationOut();
  }

  // Start hyper-sparse CHUZC, that takes place through phase1Update()
  hyperChooseColumnStart();

  if (solve_phase == kSolvePhase1) {
    // Update primal values
    phase1UpdatePrimal();

    // Update the duals with respect to feasibility changes
    basicFeasibilityChangeUpdateDual();

    // For hyper-sparse CHUZC, analyse the duals that have just changed
    hyperChooseColumnBasicFeasibilityChange();

  } else {
    // Update primal values, and identify any infeasibilities
    //
    // rebuild_reason =
    // kRebuildReasonPrimalInfeasibleInPrimalSimplex is set if a
    // primal infeasibility is found
    phase2UpdatePrimal();
  }

  assert(rebuild_reason == kRebuildReasonNo ||
         rebuild_reason == kRebuildReasonPrimalInfeasibleInPrimalSimplex);

  if (flipped) {
    info.primal_bound_swap++;
    ekk_instance_.invalidateDualInfeasibilityRecord();
    iterationAnalysis();
    localReportIter();
    num_flip_since_rebuild++;
    // Update the synthetic clock for UPDATE
    ekk_instance_.total_synthetic_tick_ += col_aq.synthetic_tick;
    return;
  }

  assert(row_out >= 0);

  // Now set the value of the entering variable
  info.baseValue_[row_out] = value_in;
  // Consider whether the entering value is feasible and, if not, take
  // action
  //
  // rebuild_reason =
  // kRebuildReasonPrimalInfeasibleInPrimalSimplex is set in
  // phase 2 if a primal infeasibility is found
  considerInfeasibleValueIn();

  // Update the dual values
  theta_dual = info.workDual_[variable_in];
  updateDual();

  // Update any non-unit primal edge weights
  if (edge_weight_mode == EdgeWeightMode::kDevex) {
    updateDevex();
  } else if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
    debugPrimalSteepestEdgeWeights("before update");
    updatePrimalSteepestEdgeWeights();
  }

  // If entering column was nonbasic free, remove it from the set
  removeNonbasicFreeColumn();

  // For hyper-sparse CHUZC, analyse the duals and weights that have
  // just changed
  hyperChooseColumnDualChange();

  if (ekk_instance_.status_.has_dual_steepest_edge_weights) {
    ekk_instance_.devDebugDualSteepestEdgeWeights("before update");
    updateDualSteepestEdgeWeights();
  }
  // Perform pivoting
  //
  // Transform the vectors used in updateFactor if the simplex NLA involves
  // scaling
  ekk_instance_.transformForUpdate(&col_aq, &row_ep, variable_in, &row_out);
  //
  // Update the sets of indices of basic and nonbasic variables
  ekk_instance_.updatePivots(variable_in, row_out, move_out);
  //
  // Update the invertible representation of the basis matrix
  ekk_instance_.updateFactor(&col_aq, &row_ep, &row_out, &rebuild_reason);

  if (ekk_instance_.status_.has_dual_steepest_edge_weights)
    ekk_instance_.devDebugDualSteepestEdgeWeights("after  update");
  if (edge_weight_mode == EdgeWeightMode::kSteepestEdge)
    debugPrimalSteepestEdgeWeights("after update");
  //
  // Update the row-wise representation of the nonbasic columns
  ekk_instance_.updateMatrix(variable_in, variable_out);
  if (info.update_count >= info.update_limit)
    rebuild_reason = kRebuildReasonUpdateLimitReached;

  // Update the iteration count
  ekk_instance_.iteration_count_++;

  // Reset the devex when there are too many errors
  if (edge_weight_mode == EdgeWeightMode::kDevex &&
      num_bad_devex_weight_ > kAllowedNumBadDevexWeight)
    initialiseDevexFramework();

  // Report on the iteration
  iterationAnalysis();
  localReportIter();

  // Update the synthetic clock for UPDATE
  ekk_instance_.total_synthetic_tick_ += col_aq.synthetic_tick;
  ekk_instance_.total_synthetic_tick_ += row_ep.synthetic_tick;

  // Perform hyper-sparse CHUZC
  hyperChooseColumn();
}